

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationData::getEquivalentScripts
          (CollationData *this,int32_t script,int32_t *dest,int32_t capacity,UErrorCode *errorCode)

{
  uint16_t *puVar1;
  int32_t iVar2;
  uint16_t uVar3;
  ulong uVar4;
  long lVar5;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar2 = 0;
  if (script < 0) {
LAB_00241c66:
    uVar3 = 0;
  }
  else {
    if (script < this->numScripts) {
      uVar4 = (ulong)(uint)script;
    }
    else {
      if ((script & 0x7ffffff8U) != 0x1000) goto LAB_00241c66;
      uVar4 = (ulong)(this->numScripts + script + -0x1000);
    }
    uVar3 = this->scriptsIndex[uVar4];
  }
  if (uVar3 != 0) {
    if (0xfff < script) {
      if (capacity < 1) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        *dest = script;
      }
      return 1;
    }
    if (this->numScripts < 1) {
      iVar2 = 0;
    }
    else {
      puVar1 = this->scriptsIndex;
      lVar5 = 0;
      iVar2 = 0;
      do {
        if (uVar3 == puVar1[lVar5]) {
          if (iVar2 < capacity) {
            dest[iVar2] = (int32_t)lVar5;
          }
          iVar2 = iVar2 + 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->numScripts);
    }
    if (capacity < iVar2) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int32_t
CollationData::getEquivalentScripts(int32_t script,
                                    int32_t dest[], int32_t capacity,
                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    int32_t index = getScriptIndex(script);
    if(index == 0) { return 0; }
    if(script >= UCOL_REORDER_CODE_FIRST) {
        // Special groups have no aliases.
        if(capacity > 0) {
            dest[0] = script;
        } else {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }

    int32_t length = 0;
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            if(length < capacity) {
                dest[length] = i;
            }
            ++length;
        }
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}